

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,int nBuf,Fts5Buffer *aBuf)

{
  u8 *puVar1;
  long lVar2;
  Fts5Buffer *pFVar3;
  int iVar4;
  long lVar5;
  Fts5DoclistIter *pFVar6;
  int *piVar7;
  Fts5DoclistIter *pFVar8;
  Fts5DoclistIter *pFVar9;
  Fts5DoclistIter *pFVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  PrefixMerger *pThis;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  size_t __n;
  long in_FS_OFFSET;
  i64 iPrev;
  Fts5Buffer tmp;
  PrefixMerger aMerger [16];
  Fts5DoclistIter *local_498;
  u8 *local_490;
  Fts5Index *local_488;
  u8 *local_480;
  ulong local_478;
  ulong local_470;
  Fts5Buffer *local_468;
  u8 *local_460;
  Fts5Buffer local_458;
  Fts5Buffer local_448;
  Fts5DoclistIter local_438;
  long local_400 [121];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_488 = p;
  memset(&local_438,0xaa,0x400);
  local_448.p = (u8 *)0x0;
  local_448.n = 0;
  local_448.nSpace = 0;
  local_458.p = (u8 *)0x0;
  local_458.n = 0;
  local_458.nSpace = 0;
  local_478 = CONCAT44(local_478._4_4_,nBuf + 1);
  __memset_chk(&local_438,0,(long)(nBuf + 1) << 6,0x400);
  lVar5 = (long)nBuf;
  local_498 = &local_438 + lVar5 * 2;
  local_498->aEof = (u8 *)0x0;
  (&local_438)[lVar5 * 2].iRowid = 0;
  (&local_438)[lVar5 * 2].aPoslist = (u8 *)0x0;
  (&local_438)[lVar5 * 2].nPoslist = 0;
  (&local_438)[lVar5 * 2].nSize = 0;
  iVar14 = p1->n;
  if (0 < (long)iVar14) {
    puVar1 = p1->p;
    (&local_438)[lVar5 * 2].aPoslist = puVar1;
    local_498->aEof = puVar1 + iVar14;
    fts5DoclistIterNext(local_498);
  }
  if (0 < nBuf) {
    uVar11 = 0;
    iVar14 = 0;
    local_490 = (u8 *)(ulong)(uint)nBuf;
    local_468 = p1;
    do {
      pFVar8 = &local_438 + uVar11 * 2;
      (&local_438)[uVar11 * 2].aPoslist = (u8 *)0x0;
      (&local_438)[uVar11 * 2].nPoslist = 0;
      (&local_438)[uVar11 * 2].nSize = 0;
      pFVar8->aEof = (u8 *)0x0;
      (&local_438)[uVar11 * 2].iRowid = 0;
      iVar4 = aBuf[uVar11].n;
      if (0 < (long)iVar4) {
        puVar1 = aBuf[uVar11].p;
        (&local_438)[uVar11 * 2].aPoslist = puVar1;
        pFVar8->aEof = puVar1 + iVar4;
        fts5DoclistIterNext(pFVar8);
      }
      if ((&local_438)[uVar11 * 2].aPoslist != (u8 *)0x0) {
        if (local_498 == (Fts5DoclistIter *)0x0) {
          pFVar6 = (Fts5DoclistIter *)0x0;
          piVar7 = (int *)&local_498;
        }
        else {
          pFVar6 = local_498;
          piVar7 = (int *)&local_498;
          if (local_498->iRowid < (&local_438)[uVar11 * 2].iRowid) {
            do {
              pFVar10 = pFVar6;
              pFVar6 = *(Fts5DoclistIter **)&pFVar10[1].nPoslist;
              if (pFVar6 == (Fts5DoclistIter *)0x0) {
                pFVar6 = (Fts5DoclistIter *)0x0;
                break;
              }
            } while (pFVar6->iRowid < (&local_438)[uVar11 * 2].iRowid);
            piVar7 = &pFVar10[1].nPoslist;
          }
        }
        local_400[uVar11 * 8] = (long)pFVar6;
        *(Fts5DoclistIter **)piVar7 = pFVar8;
      }
      iVar14 = iVar14 + aBuf[uVar11].n;
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)nBuf);
    if (iVar14 != 0) {
      local_488 = (Fts5Index *)&local_488->rc;
      iVar14 = sqlite3Fts5BufferSize
                         ((int *)local_488,&local_448,
                          local_468->n + iVar14 + (int)local_490 * 10 + 9);
      if (iVar14 == 0) {
        if (local_498 == (Fts5DoclistIter *)0x0) {
          local_480 = (u8 *)0x0;
        }
        else {
          local_470 = local_478 & 0xffffffff;
          local_480 = (u8 *)0x0;
          uVar11 = 0;
          iVar14 = local_448.n;
          do {
            puVar1 = local_448.p;
            pFVar8 = local_498;
            iVar4 = sqlite3Fts5PutVarint(local_448.p + iVar14,local_498->iRowid - uVar11);
            uVar13 = iVar14 + iVar4;
            local_448.n = uVar13;
            uVar11 = pFVar8->iRowid;
            if ((*(long *)&pFVar8[1].nPoslist != 0) &&
               (uVar11 == *(ulong *)(*(long *)&pFVar8[1].nPoslist + 8))) {
              iVar4 = 0;
              local_460 = (u8 *)0x0;
              local_498 = (Fts5DoclistIter *)0x0;
              iVar14 = 8;
              local_490 = (u8 *)(ulong)uVar13;
              do {
                if (pFVar8->iRowid != uVar11) goto LAB_001e94c6;
                pFVar6 = *(Fts5DoclistIter **)&pFVar8[1].nPoslist;
                *(undefined4 *)&pFVar8[1].iRowid = 0;
                pFVar8[1].aEof = (u8 *)0x0;
                iVar12 = pFVar8->nSize;
                pFVar8[1].aPoslist = pFVar8->aPoslist + iVar12;
                sqlite3Fts5PoslistNext64
                          (pFVar8->aPoslist + iVar12,pFVar8->nPoslist,(int *)&pFVar8[1].iRowid,
                           (i64 *)(pFVar8 + 1));
                iVar12 = pFVar8->nPoslist;
                puVar1 = pFVar8[1].aEof;
                if (-1 < (long)puVar1) {
                  if (local_498 == (Fts5DoclistIter *)0x0) {
                    pFVar10 = (Fts5DoclistIter *)0x0;
                    piVar7 = (int *)&local_498;
                  }
                  else {
                    pFVar10 = local_498;
                    piVar7 = (int *)&local_498;
                    if ((long)local_498[1].aEof < (long)puVar1) {
                      do {
                        pFVar9 = pFVar10;
                        pFVar10 = *(Fts5DoclistIter **)&pFVar9[1].nPoslist;
                        if (pFVar10 == (Fts5DoclistIter *)0x0) {
                          pFVar10 = (Fts5DoclistIter *)0x0;
                          break;
                        }
                      } while ((long)pFVar10[1].aEof < (long)puVar1);
                      piVar7 = &pFVar9[1].nPoslist;
                    }
                  }
                  *(Fts5DoclistIter **)&pFVar8[1].nPoslist = pFVar10;
                  *(Fts5DoclistIter **)piVar7 = pFVar8;
                }
                iVar14 = iVar14 + iVar12 + 10;
                iVar4 = iVar4 + 1;
                pFVar8 = pFVar6;
              } while (pFVar6 != (Fts5DoclistIter *)0x0);
              pFVar8 = (Fts5DoclistIter *)0x0;
LAB_001e94c6:
              pFVar6 = local_498;
              if ((local_498 == (Fts5DoclistIter *)0x0) ||
                 (lVar5._0_4_ = local_498[1].nPoslist, lVar5._4_4_ = local_498[1].nSize, lVar5 == 0)
                 ) {
LAB_001e9812:
                *(int *)&local_488->pConfig = 0x10b;
              }
              else {
                iVar4 = sqlite3Fts5BufferSize((int *)local_488,&local_458,iVar14 + iVar4 * 10);
                if (iVar4 == 0) {
                  local_458._8_8_ = local_458._8_8_ & 0xffffffff00000000;
                  pFVar10 = *(Fts5DoclistIter **)&pFVar6[1].nPoslist;
                  local_498 = pFVar10;
                  sqlite3Fts5PoslistSafeAppend(&local_458,(i64 *)&local_460,(i64)pFVar6[1].aEof);
                  sqlite3Fts5PoslistNext64
                            (pFVar6[1].aPoslist,pFVar6->nPoslist,(int *)&pFVar6[1].iRowid,
                             (i64 *)(pFVar6 + 1));
                  puVar1 = pFVar6[1].aEof;
                  if (-1 < (long)puVar1) {
                    if (pFVar10 == (Fts5DoclistIter *)0x0) {
                      pFVar10 = (Fts5DoclistIter *)0x0;
                      piVar7 = (int *)&local_498;
                    }
                    else {
                      piVar7 = (int *)&local_498;
                      if ((long)pFVar10[1].aEof < (long)puVar1) {
                        do {
                          pFVar9 = pFVar10;
                          pFVar10 = *(Fts5DoclistIter **)&pFVar9[1].nPoslist;
                          if (pFVar10 == (Fts5DoclistIter *)0x0) {
                            pFVar10 = (Fts5DoclistIter *)0x0;
                            break;
                          }
                        } while ((long)pFVar10[1].aEof < (long)puVar1);
                        piVar7 = &pFVar9[1].nPoslist;
                      }
                    }
                    *(Fts5DoclistIter **)&pFVar6[1].nPoslist = pFVar10;
                    *(Fts5DoclistIter **)piVar7 = pFVar6;
                    pFVar10 = local_498;
                  }
                  lVar2._0_4_ = pFVar10[1].nPoslist;
                  lVar2._4_4_ = pFVar10[1].nSize;
                  while (lVar2 != 0) {
                    if (pFVar10[1].aEof != local_460) {
                      sqlite3Fts5PoslistSafeAppend
                                (&local_458,(i64 *)&local_460,(i64)pFVar10[1].aEof);
                    }
                    sqlite3Fts5PoslistNext64
                              (pFVar10[1].aPoslist,pFVar10->nPoslist,(int *)&pFVar10[1].iRowid,
                               (i64 *)(pFVar10 + 1));
                    local_498 = *(Fts5DoclistIter **)&pFVar10[1].nPoslist;
                    puVar1 = pFVar10[1].aEof;
                    if (-1 < (long)puVar1) {
                      if (local_498 == (Fts5DoclistIter *)0x0) {
                        pFVar6 = (Fts5DoclistIter *)0x0;
                        piVar7 = (int *)&local_498;
                      }
                      else {
                        piVar7 = (int *)&local_498;
                        pFVar6 = local_498;
                        if ((long)local_498[1].aEof < (long)puVar1) {
                          do {
                            pFVar9 = pFVar6;
                            pFVar6 = *(Fts5DoclistIter **)&pFVar9[1].nPoslist;
                            if (pFVar6 == (Fts5DoclistIter *)0x0) {
                              pFVar6 = (Fts5DoclistIter *)0x0;
                              break;
                            }
                          } while ((long)pFVar6[1].aEof < (long)puVar1);
                          piVar7 = &pFVar9[1].nPoslist;
                        }
                      }
                      *(Fts5DoclistIter **)&pFVar10[1].nPoslist = pFVar6;
                      *(Fts5DoclistIter **)piVar7 = pFVar10;
                    }
                    lVar2._0_4_ = local_498[1].nPoslist;
                    lVar2._4_4_ = local_498[1].nSize;
                    pFVar10 = local_498;
                  }
                  if (pFVar10[1].aEof != local_460) {
                    sqlite3Fts5PoslistSafeAppend(&local_458,(i64 *)&local_460,(i64)pFVar10[1].aEof);
                  }
                  puVar1 = local_448.p;
                  uVar15 = (long)pFVar10->nPoslist - (long)(int)pFVar10[1].iRowid;
                  iVar4 = local_458.n;
                  __n = (size_t)local_458.n;
                  lVar5 = __n + uVar15;
                  if ((int)lVar5 <= iVar14 + -8) {
                    iVar12 = (int)local_490;
                    local_478 = uVar11;
                    iVar14 = sqlite3Fts5PutVarint(local_448.p + iVar12,lVar5 * 2);
                    iVar14 = iVar14 + iVar12;
                    local_490 = puVar1;
                    local_480 = local_458.p;
                    memcpy(puVar1 + iVar14,local_458.p,__n);
                    iVar14 = iVar14 + iVar4;
                    local_448.n = iVar14;
                    if (0 < (int)uVar15) {
                      memcpy(local_490 + iVar14,pFVar10[1].aPoslist + (int)pFVar10[1].iRowid,
                             uVar15 & 0xffffffff);
                      iVar14 = iVar14 + (int)uVar15;
                      local_448.n = iVar14;
                    }
                    uVar15 = local_470;
                    uVar11 = local_478;
                    uVar16 = 0;
                    local_498 = pFVar8;
                    do {
                      if ((((&local_438)[uVar16 * 2].aPoslist != (u8 *)0x0) &&
                          ((&local_438)[uVar16 * 2].iRowid == uVar11)) &&
                         (fts5DoclistIterNext(&local_438 + uVar16 * 2),
                         (&local_438)[uVar16 * 2].aPoslist != (u8 *)0x0)) {
                        if (local_498 == (Fts5DoclistIter *)0x0) {
                          pFVar8 = (Fts5DoclistIter *)0x0;
                          piVar7 = (int *)&local_498;
                        }
                        else {
                          pFVar8 = local_498;
                          piVar7 = (int *)&local_498;
                          if (local_498->iRowid < (&local_438)[uVar16 * 2].iRowid) {
                            do {
                              pFVar6 = pFVar8;
                              pFVar8 = *(Fts5DoclistIter **)&pFVar6[1].nPoslist;
                              if (pFVar8 == (Fts5DoclistIter *)0x0) {
                                pFVar8 = (Fts5DoclistIter *)0x0;
                                break;
                              }
                            } while (pFVar8->iRowid < (&local_438)[uVar16 * 2].iRowid);
                            piVar7 = &pFVar6[1].nPoslist;
                          }
                        }
                        local_400[uVar16 * 8] = (long)pFVar8;
                        *(Fts5DoclistIter **)piVar7 = &local_438 + uVar16 * 2;
                      }
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != uVar15);
                    goto LAB_001e97ef;
                  }
                  if (*(int *)&local_488->pConfig == 0) goto LAB_001e9812;
                }
              }
              local_480 = local_458.p;
              break;
            }
            memcpy(puVar1 + (int)uVar13,pFVar8->aPoslist,
                   (long)pFVar8->nSize + (long)pFVar8->nPoslist);
            iVar14 = uVar13 + pFVar8->nPoslist + pFVar8->nSize;
            local_448.n = iVar14;
            fts5DoclistIterNext(pFVar8);
            local_498 = *(Fts5DoclistIter **)&pFVar8[1].nPoslist;
            if (pFVar8->aPoslist != (u8 *)0x0) {
              if (local_498 == (Fts5DoclistIter *)0x0) {
                pFVar6 = (Fts5DoclistIter *)0x0;
                piVar7 = (int *)&local_498;
              }
              else {
                pFVar6 = local_498;
                piVar7 = (int *)&local_498;
                if (local_498->iRowid < pFVar8->iRowid) {
                  do {
                    pFVar10 = pFVar6;
                    pFVar6 = *(Fts5DoclistIter **)&pFVar10[1].nPoslist;
                    if (pFVar6 == (Fts5DoclistIter *)0x0) {
                      pFVar6 = (Fts5DoclistIter *)0x0;
                      break;
                    }
                  } while (pFVar6->iRowid < pFVar8->iRowid);
                  piVar7 = &pFVar10[1].nPoslist;
                }
              }
              *(Fts5DoclistIter **)&pFVar8[1].nPoslist = pFVar6;
              *(Fts5DoclistIter **)piVar7 = pFVar8;
            }
LAB_001e97ef:
          } while (local_498 != (Fts5DoclistIter *)0x0);
        }
        pFVar3 = local_468;
        sqlite3_free(local_468->p);
        pFVar3->p = (u8 *)0x0;
        pFVar3->n = 0;
        pFVar3->nSpace = 0;
        sqlite3_free(local_480);
        puVar1 = local_448.p + local_448.n;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        pFVar3->p = local_448.p;
        pFVar3->n = local_448.n;
        pFVar3->nSpace = local_448.nSpace;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  int nBuf,                       /* Number of buffers in array aBuf[] */
  Fts5Buffer *aBuf                /* Other lists to merge in */
){
#define fts5PrefixMergerNextPosition(p) \
  sqlite3Fts5PoslistNext64((p)->aPos,(p)->iter.nPoslist,&(p)->iOff,&(p)->iPos)
#define FTS5_MERGE_NLIST 16
  PrefixMerger aMerger[FTS5_MERGE_NLIST];
  PrefixMerger *pHead = 0;
  int i;
  int nOut = 0;
  Fts5Buffer out = {0, 0, 0};
  Fts5Buffer tmp = {0, 0, 0};
  i64 iLastRowid = 0;

  /* Initialize a doclist-iterator for each input buffer. Arrange them in
  ** a linked-list starting at pHead in ascending order of rowid. Avoid
  ** linking any iterators already at EOF into the linked list at all. */
  assert( nBuf+1<=(int)(sizeof(aMerger)/sizeof(aMerger[0])) );
  memset(aMerger, 0, sizeof(PrefixMerger)*(nBuf+1));
  pHead = &aMerger[nBuf];
  fts5DoclistIterInit(p1, &pHead->iter);
  for(i=0; i<nBuf; i++){
    fts5DoclistIterInit(&aBuf[i], &aMerger[i].iter);
    fts5PrefixMergerInsertByRowid(&pHead, &aMerger[i]);
    nOut += aBuf[i].n;
  }
  if( nOut==0 ) return;
  nOut += p1->n + 9 + 10*nBuf;

  /* The maximum size of the output is equal to the sum of the
  ** input sizes + 1 varint (9 bytes). The extra varint is because if the
  ** first rowid in one input is a large negative number, and the first in
  ** the other a non-negative number, the delta for the non-negative
  ** number will be larger on disk than the literal integer value
  ** was.
  **
  ** Or, if the input position-lists are corrupt, then the output might
  ** include up to (nBuf+1) extra 10-byte positions created by interpreting -1
  ** (the value PoslistNext64() uses for EOF) as a position and appending
  ** it to the output. This can happen at most once for each input
  ** position-list, hence (nBuf+1) 10 byte paddings.  */
  if( sqlite3Fts5BufferSize(&p->rc, &out, nOut) ) return;

  while( pHead ){
    fts5MergeAppendDocid(&out, iLastRowid, pHead->iter.iRowid);

    if( pHead->pNext && iLastRowid==pHead->pNext->iter.iRowid ){
      /* Merge data from two or more poslists */
      i64 iPrev = 0;
      int nTmp = FTS5_DATA_ZERO_PADDING;
      int nMerge = 0;
      PrefixMerger *pSave = pHead;
      PrefixMerger *pThis = 0;
      int nTail = 0;

      pHead = 0;
      while( pSave && pSave->iter.iRowid==iLastRowid ){
        PrefixMerger *pNext = pSave->pNext;
        pSave->iOff = 0;
        pSave->iPos = 0;
        pSave->aPos = &pSave->iter.aPoslist[pSave->iter.nSize];
        fts5PrefixMergerNextPosition(pSave);
        nTmp += pSave->iter.nPoslist + 10;
        nMerge++;
        fts5PrefixMergerInsertByPosition(&pHead, pSave);
        pSave = pNext;
      }

      if( pHead==0 || pHead->pNext==0 ){
        p->rc = FTS5_CORRUPT;
        break;
      }

      /* See the earlier comment in this function for an explanation of why
      ** corrupt input position lists might cause the output to consume
      ** at most nMerge*10 bytes of unexpected space. */
      if( sqlite3Fts5BufferSize(&p->rc, &tmp, nTmp+nMerge*10) ){
        break;
      }
      fts5BufferZero(&tmp);

      pThis = pHead;
      pHead = pThis->pNext;
      sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
      fts5PrefixMergerNextPosition(pThis);
      fts5PrefixMergerInsertByPosition(&pHead, pThis);

      while( pHead->pNext ){
        pThis = pHead;
        if( pThis->iPos!=iPrev ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
        }
        fts5PrefixMergerNextPosition(pThis);
        pHead = pThis->pNext;
        fts5PrefixMergerInsertByPosition(&pHead, pThis);
      }

      if( pHead->iPos!=iPrev ){
        sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pHead->iPos);
      }
      nTail = pHead->iter.nPoslist - pHead->iOff;

      /* WRITEPOSLISTSIZE */
      assert_nc( tmp.n+nTail<=nTmp );
      assert( tmp.n+nTail<=nTmp+nMerge*10 );
      if( tmp.n+nTail>nTmp-FTS5_DATA_ZERO_PADDING ){
        if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferSafeAppendVarint(&out, (tmp.n+nTail) * 2);
      fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
      if( nTail>0 ){
        fts5BufferSafeAppendBlob(&out, &pHead->aPos[pHead->iOff], nTail);
      }

      pHead = pSave;
      for(i=0; i<nBuf+1; i++){
        PrefixMerger *pX = &aMerger[i];
        if( pX->iter.aPoslist && pX->iter.iRowid==iLastRowid ){
          fts5DoclistIterNext(&pX->iter);
          fts5PrefixMergerInsertByRowid(&pHead, pX);
        }
      }

    }else{
      /* Copy poslist from pHead to output */
      PrefixMerger *pThis = pHead;
      Fts5DoclistIter *pI = &pThis->iter;
      fts5BufferSafeAppendBlob(&out, pI->aPoslist, pI->nPoslist+pI->nSize);
      fts5DoclistIterNext(pI);
      pHead = pThis->pNext;
      fts5PrefixMergerInsertByRowid(&pHead, pThis);
    }
  }

  fts5BufferFree(p1);
  fts5BufferFree(&tmp);
  memset(&out.p[out.n], 0, FTS5_DATA_ZERO_PADDING);
  *p1 = out;
}